

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SRGBTestCase::addTexture
          (SRGBTestCase *this,TextureType targetType,int width,int height,Vec4 *color,WrapMode wrapS
          ,WrapMode wrapT,FilterMode minFilter,FilterMode magFilter,SRGBDecode decoding)

{
  pointer *pppSVar1;
  SRGBTestTexture *pSVar2;
  TextureFormat texFormat;
  RenderContext *context;
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
  *p_Var3;
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
  *this_00;
  deUint32 sizedFormat;
  SRGBTestTexture *pSVar4;
  long lVar5;
  ulong uVar6;
  pointer __dest;
  int py;
  int y;
  ulong uVar7;
  undefined4 in_register_00000034;
  ulong uVar8;
  int px;
  int x;
  size_t __n;
  Vector<float,_4> local_40;
  
  pSVar4 = (SRGBTestTexture *)operator_new(0xb8);
  pSVar2 = (SRGBTestTexture *)(this->super_TestCase).m_context;
  texFormat = this->m_internalFormat;
  tcu::Vector<float,_4>::Vector
            (&local_40,(Vector<float,_4> *)CONCAT44(in_register_00000034,targetType));
  pSVar4->m_context = (Context *)pSVar2;
  context = (RenderContext *)(pSVar2->m_source)._vptr_Texture2D;
  sizedFormat = glu::getInternalFormat(texFormat);
  glu::Texture2D::Texture2D(&pSVar4->m_source,context,sizedFormat,0x80,0x80);
  pSVar4->m_targetType = TEXTURETYPE_2D;
  pSVar4->m_internalFormat = texFormat;
  pSVar4->m_width = 0x80;
  pSVar4->m_height = 0x80;
  tcu::Vector<float,_4>::Vector(&pSVar4->m_color,&local_40);
  pSVar4->m_wrapS = MIRRORED_REPEAT_GL;
  pSVar4->m_wrapT = MIRRORED_REPEAT_GL;
  pSVar4->m_minFilter = LINEAR;
  pSVar4->m_magFilter = LINEAR;
  pSVar4->m_decoding = width;
  pSVar4->m_hasSampler = false;
  lVar5 = (**(code **)(*(((SRGBTestTexture *)pSVar4->m_context)->m_source)._vptr_Texture2D + 0x18))
                    ();
  (**(code **)(lVar5 + 0xb8))(-(uint)(pSVar4->m_targetType != TEXTURETYPE_2D) | 0xde1);
  tcu::Texture2D::allocLevel(&(pSVar4->m_source).m_refTexture,0);
  for (y = 0; y < pSVar4->m_height; y = y + 1) {
    for (x = 0; x < pSVar4->m_width; x = x + 1) {
      tcu::PixelBufferAccess::setPixel
                ((((vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *)
                  ((long)&(pSVar4->m_source).m_refTexture.super_TextureLevelPyramid + 0x20))->
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 )._M_impl.super__Vector_impl_data._M_start,&pSVar4->m_color,x,y,0);
    }
  }
  (**(code **)(lVar5 + 0xb8))(-(uint)(pSVar4->m_targetType != TEXTURETYPE_2D) | 0xde1,0);
  p_Var3 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
            *)(this->m_textureSourceList).
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (p_Var3 == (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                 *)(this->m_textureSourceList).
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    this_00 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
               *)(this->m_textureSourceList).
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    __n = (long)p_Var3 - (long)this_00;
    if (__n == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar8 = (long)__n >> 3;
    uVar6 = 1;
    if (p_Var3 != this_00) {
      uVar6 = uVar8;
    }
    uVar7 = uVar6 + uVar8;
    if (0xffffffffffffffe < uVar7) {
      uVar7 = 0xfffffffffffffff;
    }
    if (CARRY8(uVar6,uVar8)) {
      uVar7 = 0xfffffffffffffff;
    }
    if (uVar7 == 0) {
      __dest = (pointer)0x0;
    }
    else {
      __dest = (pointer)operator_new(uVar7 * 8);
    }
    __dest[uVar8] = pSVar4;
    if (0 < (long)__n) {
      memmove(__dest,this_00,__n);
    }
    std::
    _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
    ::_M_deallocate(this_00,(pointer)((long)(this->m_textureSourceList).
                                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)this_00 >> 3),(size_t)this_00);
    (this->m_textureSourceList).
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
    ._M_impl.super__Vector_impl_data._M_start = __dest;
    (this->m_textureSourceList).
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)__dest + __n + 8);
    (this->m_textureSourceList).
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __dest + uVar7;
  }
  else {
    (p_Var3->_M_impl).super__Vector_impl_data._M_start = (pointer)pSVar4;
    pppSVar1 = &(this->m_textureSourceList).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppSVar1 = *pppSVar1 + 1;
  }
  return;
}

Assistant:

void SRGBTestCase::addTexture (	const glu::TextureTestUtil::TextureType	targetType,
								const int								width,
								const int								height,
								const tcu::Vec4							color,
								const tcu::Sampler::WrapMode			wrapS,
								const tcu::Sampler::WrapMode			wrapT,
								const tcu::Sampler::FilterMode			minFilter,
								const tcu::Sampler::FilterMode			magFilter,
								const SRGBDecode						decoding)
{
	SRGBTestTexture* texture = new SRGBTestTexture(m_context, targetType, m_internalFormat, width, height, color, wrapS, wrapT, minFilter, magFilter, decoding);
	m_textureSourceList.push_back(texture);
}